

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_4::saveFlatTiledImage(string *fileName,Header *hdr,FlatImage *img,DataWindowSource dws)

{
  uint xs;
  uint ys;
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  LevelMode LVar4;
  LevelRoundingMode LVar5;
  int iVar6;
  int iVar7;
  TiledOutputFile *out_00;
  Attribute *pAVar8;
  uint *puVar9;
  long lVar10;
  undefined4 extraout_var;
  string *psVar11;
  string *psVar12;
  char *pcVar13;
  Image *in_RDX;
  undefined1 auVar14 [16];
  int x_1;
  int y;
  int x;
  TiledOutputFile out;
  ConstIterator i_1;
  FlatImageLevel *level;
  ConstIterator i;
  Header newHdr;
  FlatImageLevel *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  DataWindowSource in_stack_fffffffffffffe4c;
  Image *in_stack_fffffffffffffe50;
  Header *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  int local_114;
  int local_110;
  int local_10c;
  TiledOutputFile local_108 [32];
  undefined5 local_e8;
  undefined3 uStack_e3;
  undefined5 local_e0;
  undefined3 uStack_db;
  undefined5 local_d8;
  undefined3 local_d3;
  undefined5 uStack_d0;
  const_iterator local_c8;
  const_iterator local_c0;
  undefined8 local_b8;
  TileDescription local_a0;
  TileDescription local_90;
  TiledOutputFile *local_80;
  undefined8 local_68;
  Vec2<float> local_60;
  TileDescription local_58 [4];
  Image *local_18;
  
  local_18 = in_RDX;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_4::Header::Header((Header *)0x3f800000,local_58,0x40,0x40,&local_60,0,3);
  local_68 = Imf_3_4::Header::begin();
  while( true ) {
    out_00 = (TiledOutputFile *)Imf_3_4::Header::end();
    local_80 = out_00;
    uVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (ConstIterator *)in_stack_fffffffffffffde8);
    if (!(bool)uVar1) break;
    in_stack_fffffffffffffec0 = Header::ConstIterator::name((ConstIterator *)0x12d37a);
    iVar6 = strcmp(in_stack_fffffffffffffec0,"dataWindow");
    if (iVar6 != 0) {
      pcVar13 = Header::ConstIterator::name((ConstIterator *)0x12d3ae);
      iVar6 = strcmp(pcVar13,"tiles");
      if (iVar6 != 0) {
        pcVar13 = Header::ConstIterator::name((ConstIterator *)0x12d3e2);
        iVar6 = strcmp(pcVar13,"channels");
        if (iVar6 != 0) {
          pAVar8 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x12d412);
          Header::ConstIterator::attribute((ConstIterator *)0x12d429);
          Imf_3_4::Header::insert((char *)local_58,pAVar8);
        }
      }
    }
    Header::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  bVar2 = Imf_3_4::Header::hasTileDescription();
  if ((bVar2 & 1) == 0) {
    LVar4 = Image::levelMode(local_18);
    LVar5 = Image::levelRoundingMode(local_18);
    TileDescription::TileDescription(&local_a0,0x40,0x40,LVar4,LVar5);
    Imf_3_4::Header::setTileDescription(local_58);
  }
  else {
    puVar9 = (uint *)Imf_3_4::Header::tileDescription();
    xs = *puVar9;
    lVar10 = Imf_3_4::Header::tileDescription();
    ys = *(uint *)(lVar10 + 4);
    LVar4 = Image::levelMode(local_18);
    LVar5 = Image::levelRoundingMode(local_18);
    TileDescription::TileDescription(&local_90,xs,ys,LVar4,LVar5);
    Imf_3_4::Header::setTileDescription(local_58);
  }
  dataWindowForFile(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffde8);
  iVar6 = (*local_18->_vptr_Image[6])(local_18,0);
  local_b8 = CONCAT44(extraout_var,iVar6);
  local_c0._M_node = (_Base_ptr)FlatImageLevel::begin(in_stack_fffffffffffffde8);
  while( true ) {
    local_c8._M_node = (_Base_ptr)FlatImageLevel::end(in_stack_fffffffffffffde8);
    bVar3 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (ConstIterator *)in_stack_fffffffffffffde8);
    if (!bVar3) break;
    psVar11 = (string *)Imf_3_4::Header::channels();
    psVar12 = FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12d6db);
    FlatImageLevel::ConstIterator::channel((ConstIterator *)0x12d6ef);
    auVar14 = ImageChannel::channel
                        ((ImageChannel *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    local_e8 = auVar14._0_5_;
    uStack_e3 = auVar14._5_3_;
    local_e0 = auVar14._8_5_;
    uStack_db = auVar14._13_3_;
    uStack_d0 = local_e0;
    local_d8 = local_e8;
    local_d3 = uStack_e3;
    Imf_3_4::ChannelList::insert(psVar11,(Channel *)psVar12);
    FlatImageLevel::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  pcVar13 = (char *)std::__cxx11::string::c_str();
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile(local_108,pcVar13,(Header *)local_58,iVar6);
  LVar4 = Image::levelMode(local_18);
  if (LVar4 == ONE_LEVEL) {
    anon_unknown_29::saveLevel
              (out_00,(FlatImage *)CONCAT17(uVar1,in_stack_fffffffffffffec8),
               (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_fffffffffffffec0);
  }
  else if (LVar4 == MIPMAP_LEVELS) {
    local_10c = 0;
    while (iVar6 = local_10c, iVar7 = Imf_3_4::TiledOutputFile::numLevels(), iVar6 < iVar7) {
      anon_unknown_29::saveLevel
                (out_00,(FlatImage *)CONCAT17(uVar1,in_stack_fffffffffffffec8),
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_fffffffffffffec0);
      local_10c = local_10c + 1;
    }
  }
  else if (LVar4 == RIPMAP_LEVELS) {
    for (local_110 = 0; iVar6 = Imf_3_4::TiledOutputFile::numYLevels(), local_110 < iVar6;
        local_110 = local_110 + 1) {
      local_114 = 0;
      while (iVar6 = local_114, iVar7 = Imf_3_4::TiledOutputFile::numXLevels(), iVar6 < iVar7) {
        anon_unknown_29::saveLevel
                  (out_00,(FlatImage *)CONCAT17(uVar1,in_stack_fffffffffffffec8),
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_fffffffffffffec0);
        local_114 = local_114 + 1;
      }
    }
  }
  Imf_3_4::TiledOutputFile::~TiledOutputFile(local_108);
  Imf_3_4::Header::~Header((Header *)local_58);
  return;
}

Assistant:

void
saveFlatTiledImage (
    const string&    fileName,
    const Header&    hdr,
    const FlatImage& img,
    DataWindowSource dws)
{
    Header newHdr;

    for (Header::ConstIterator i = hdr.begin (); i != hdr.end (); ++i)
    {
        if (strcmp (i.name (), "dataWindow") && strcmp (i.name (), "tiles") &&
            strcmp (i.name (), "channels"))
        {
            newHdr.insert (i.name (), i.attribute ());
        }
    }

    if (hdr.hasTileDescription ())
    {
        newHdr.setTileDescription (TileDescription (
            hdr.tileDescription ().xSize,
            hdr.tileDescription ().ySize,
            img.levelMode (),
            img.levelRoundingMode ()));
    }
    else
    {
        newHdr.setTileDescription (TileDescription (
            64, // xSize
            64, // ySize
            img.levelMode (),
            img.levelRoundingMode ()));
    }

    newHdr.dataWindow () = dataWindowForFile (hdr, img, dws);

    const FlatImageLevel& level = img.level (0, 0);

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        newHdr.channels ().insert (i.name (), i.channel ().channel ());

    TiledOutputFile out (fileName.c_str (), newHdr);

    switch (img.levelMode ())
    {
        case ONE_LEVEL: saveLevel (out, img, 0, 0); break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < out.numLevels (); ++x)
                saveLevel (out, img, x, x);

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < out.numYLevels (); ++y)
                for (int x = 0; x < out.numXLevels (); ++x)
                    saveLevel (out, img, x, y);

            break;

        default: assert (false);
    }
}